

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O1

void set_vbp_thresholds(AV1_COMP *cpi,int64_t *thresholds,uint64_t blk_sad,int qindex,
                       int content_lowsumdiff,int source_sad_nonrd,int source_sad_rd,
                       _Bool is_segment_id_boosted,int lighting_change)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  int16_t iVar5;
  NOISE_LEVEL NVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  double dVar17;
  
  bVar9 = (cpi->common).current_frame.frame_type;
  lVar14 = 1;
  if ((bVar9 & 0xfd) == 0) {
    lVar14 = 0x78;
  }
  iVar5 = av1_ac_quant_QTX(qindex,0,((cpi->common).seq_params)->bit_depth);
  lVar14 = iVar5 * lVar14;
  iVar13 = (cpi->common).height * (cpi->common).width;
  bVar8 = (byte)(cpi->sf).rt_sf.var_part_split_threshold_shift;
  if ((bVar9 & 0xfd) == 0) {
    iVar1 = (cpi->sf).rt_sf.force_large_partition_blocks_intra;
    if (iVar1 != 0) {
      lVar14 = lVar14 << ((((cpi->oxcf).mode == '\x02') + bVar8) - 8 & 0x3f);
    }
    *thresholds = lVar14;
    thresholds[1] = lVar14;
    if (iVar13 < 0xe1000) {
      thresholds[2] = lVar14 / 3;
      lVar15 = lVar14 >> 1;
    }
    else {
      lVar15 = lVar14 >> (iVar1 == 0) * '\x02';
      thresholds[2] = lVar15;
    }
    thresholds[3] = lVar15;
    thresholds[4] = lVar14 << 2;
    return;
  }
  iVar1 = (cpi->common).quant_params.base_qindex;
  if ((((0x4b000 < iVar13) && (content_lowsumdiff != 0)) && ((cpi->noise_estimate).enabled != 0)) &&
     (0x3c < (cpi->common).current_frame.frame_number)) {
    NVar6 = av1_noise_estimate_extract_level(&cpi->noise_estimate);
    if (NVar6 == kMedium) {
      if ((cpi->sf).rt_sf.prefer_large_partition_blocks == 0) {
        lVar14 = lVar14 + (lVar14 >> 2);
      }
    }
    else if (NVar6 == kHigh) {
      lVar14 = lVar14 * 5 >> 1;
    }
  }
  iVar16 = (cpi->oxcf).speed;
  lVar15 = lVar14 >> 1;
  if ((cpi->rc).frame_source_sad == 0) {
    lVar15 = 0;
  }
  if ((cpi->ppi->rtc_ref).non_reference_frame == 0) {
    lVar15 = 0;
  }
  lVar7 = lVar15 + lVar14 >> 2;
  if (iVar16 < 8) {
    lVar7 = 0;
  }
  lVar7 = lVar7 + lVar15 + lVar14;
  if ((2 < source_sad_nonrd && 10 < iVar16) && ((cpi->rc).high_motion_content_screen_rtc != 0)) {
    lVar7 = lVar7 * 0x10;
  }
  *thresholds = lVar7 >> 1;
  thresholds[1] = lVar7;
  thresholds[3] = (lVar7 << (bVar8 & 0x3f)) << (0xe0fff < iVar13);
  if (iVar13 < 0x18c01) {
    uVar2 = (cpi->sf).rt_sf.var_part_based_on_qidx;
    uVar11 = 0;
    if (0 < (int)uVar2) {
      uVar11 = uVar2;
    }
    uVar12 = (ulong)uVar11;
    if (2 < source_sad_rd) {
      uVar12 = 0;
    }
    if (2 < (int)uVar2) {
      uVar12 = (ulong)uVar2;
    }
    iVar16 = (&DAT_00dc9334)[uVar12 * 2];
    if (iVar16 - iVar1 == 0 || iVar16 < iVar1) {
      lVar14 = lVar7 * 5 >> 1;
      thresholds[1] = lVar7 * 5 >> 4;
      thresholds[2] = lVar14 * 4;
      thresholds[3] = lVar14 << 5;
    }
    else {
      iVar3 = (&DAT_00dc9330)[uVar12 * 2];
      if (iVar1 < iVar3) {
        thresholds[1] = lVar7 >> 3;
        thresholds[2] = lVar7 >> 1;
        lVar7 = lVar7 << 3;
      }
      else {
        lVar14 = (long)(iVar1 - iVar3);
        lVar15 = (long)(iVar16 - iVar1);
        uVar12 = 1;
        if (1 < iVar16 - iVar3) {
          uVar12 = (ulong)(uint)(iVar16 - iVar3);
        }
        lVar7 = (lVar7 * lVar15 + (lVar7 * 5 >> 1) * lVar14) / (long)uVar12;
        thresholds[1] = lVar7 >> 3;
        thresholds[2] = ((lVar7 >> 1) * lVar15 + lVar7 * lVar14) / (long)uVar12;
        lVar7 = ((lVar14 * 0x20 + lVar15 * 8) * lVar7) / (long)uVar12;
      }
      thresholds[3] = lVar7;
    }
  }
  else if (iVar13 < 0xe1000) {
    lVar7 = (lVar7 >> 2) + lVar7;
LAB_00ae2a97:
    thresholds[2] = lVar7;
  }
  else {
    if (iVar13 < 0x1fa400) {
      lVar7 = lVar7 * 2;
    }
    else if ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
      if (0x383fff < iVar13) {
        lVar7 = lVar7 * 7 >> 1;
        goto LAB_00ae2a97;
      }
      lVar7 = lVar7 * 5 >> 1;
    }
    else {
      if (7 < iVar16) {
        lVar7 = lVar7 * 2;
      }
      lVar7 = lVar7 * 3;
    }
    thresholds[2] = lVar7;
  }
  iVar16 = (cpi->sf).rt_sf.prefer_large_partition_blocks;
  if (iVar16 < 3) {
    if (iVar16 == 2) {
      lVar14 = thresholds[2] * 3;
      if (2 < source_sad_nonrd) {
        lVar14 = thresholds[2];
      }
      thresholds[1] = thresholds[1] << (source_sad_nonrd < 3) * '\x02';
      thresholds[2] = lVar14;
      goto LAB_00ae2f47;
    }
    if (iVar16 < 1) goto LAB_00ae2f47;
    dVar17 = 1.0;
    if ((0x36 < iVar1) && (dVar17 = 0.0, iVar1 < 0x92)) {
      dVar17 = 1.0 - (double)((iVar1 - 0x37U) / 0x5a);
    }
    dVar4 = 1.0 - dVar17;
    iVar13 = (int)(dVar4 * (double)(thresholds[1] * 2) + dVar17 * (double)thresholds[1]);
    iVar16 = (int)(dVar4 * (double)(thresholds[2] * 2) + dVar17 * (double)thresholds[2]);
    thresholds[1] = CONCAT44(-(uint)(iVar13 < 0),iVar13);
    *(int *)(thresholds + 3) = iVar16;
    *(uint *)((long)thresholds + 0x1c) = -(uint)(iVar16 < 0);
    lVar14 = (long)(int)((double)(thresholds[3] << (source_sad_nonrd < 3) + 1) * dVar4 +
                        (double)thresholds[3] * dVar17);
  }
  else {
    if (iVar1 < 0x50) {
      dVar17 = 1.0;
    }
    else {
      dVar17 = 0.0;
      if (iVar1 < 0x79) {
        dVar17 = 1.0 - (double)((iVar1 - 0x50U) / 0x28);
      }
    }
    if (0x4b000 < iVar13) {
      lVar14 = 0;
      do {
        lVar15 = (thresholds + lVar14)[1];
        thresholds[lVar14] = thresholds[lVar14] * 2;
        (thresholds + lVar14)[1] = lVar15 * 2;
        lVar14 = lVar14 + 2;
      } while (lVar14 != 4);
    }
    if (iVar13 < 0x18c01) {
      thresholds[3] = 0x7fffffffffffffff;
      if (is_segment_id_boosted) {
        thresholds[1] = thresholds[1] * 2;
        bVar9 = 3;
      }
      else {
        thresholds[1] = thresholds[1] << 2;
        bVar9 = source_sad_nonrd < 3 | 4;
      }
      thresholds[2] = thresholds[2] << bVar9;
      if ((cpi->svc).temporal_layer_id == 0) {
        iVar13 = (cpi->svc).number_temporal_layers;
        uVar12 = 25000;
        if (1 < iVar13) {
          uVar12 = 40000;
        }
        uVar10 = 50000;
        if (1 < iVar13) {
          uVar10 = 70000;
        }
      }
      else {
        uVar10 = 50000;
        uVar12 = 25000;
      }
      if ((((is_segment_id_boosted) || (blk_sad < 0x61a9)) || (uVar12 <= (cpi->rc).avg_source_sad))
         || ((lighting_change != 0 || (uVar10 <= blk_sad)))) goto LAB_00ae2f47;
      lVar14 = thresholds[2] * 3 >> 2;
      thresholds[2] = lVar14;
      lVar14 = lVar14 << 3;
    }
    else {
      if ((0x4b000 < iVar13 && !is_segment_id_boosted) &&
         ((source_sad_nonrd != 4 || (50000 < (cpi->rc).avg_source_sad)))) {
        *thresholds = (*thresholds >> 1) + *thresholds;
        thresholds[3] = 0x7fffffffffffffff;
        if (100 < iVar1) {
          iVar13 = (int)((1.0 - dVar17) * (double)(thresholds[1] * 2) +
                        dVar17 * (double)thresholds[1]);
          iVar16 = (int)((1.0 - dVar17) * (double)(thresholds[2] * 2) +
                        dVar17 * (double)thresholds[2]);
          *(int *)(thresholds + 1) = iVar13;
          *(uint *)((long)thresholds + 0xc) = -(uint)(iVar13 < 0);
          *(int *)(thresholds + 2) = iVar16;
          *(uint *)((long)thresholds + 0x14) = -(uint)(iVar16 < 0);
        }
        goto LAB_00ae2f47;
      }
      if ((iVar1 < 0x65 || is_segment_id_boosted) ||
         ((source_sad_nonrd == 4 && ((cpi->rc).avg_source_sad < 0xc351)))) goto LAB_00ae2f47;
      iVar13 = (int)((1.0 - dVar17) * (double)(thresholds[1] << 2) + dVar17 * (double)thresholds[1])
      ;
      iVar16 = (int)((1.0 - dVar17) * (double)(thresholds[2] << 4) + dVar17 * (double)thresholds[2])
      ;
      *(int *)(thresholds + 1) = iVar13;
      *(uint *)((long)thresholds + 0xc) = -(uint)(iVar13 < 0);
      *(int *)(thresholds + 2) = iVar16;
      *(uint *)((long)thresholds + 0x14) = -(uint)(iVar16 < 0);
      lVar14 = 0x7fffffffffffffff;
    }
  }
  thresholds[3] = lVar14;
LAB_00ae2f47:
  if ((iVar1 < 0x80) && ((cpi->sf).part_sf.disable_8x8_part_based_on_qidx != 0)) {
    thresholds[3] = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

static inline void set_vbp_thresholds(AV1_COMP *cpi, int64_t thresholds[],
                                      uint64_t blk_sad, int qindex,
                                      int content_lowsumdiff,
                                      int source_sad_nonrd, int source_sad_rd,
                                      bool is_segment_id_boosted,
                                      int lighting_change) {
  AV1_COMMON *const cm = &cpi->common;
  const int is_key_frame = frame_is_intra_only(cm);
  const int threshold_multiplier = is_key_frame ? 120 : 1;
  const int ac_q = av1_ac_quant_QTX(qindex, 0, cm->seq_params->bit_depth);
  int64_t threshold_base = (int64_t)(threshold_multiplier * ac_q);
  const int current_qindex = cm->quant_params.base_qindex;
  const int threshold_left_shift = cpi->sf.rt_sf.var_part_split_threshold_shift;
  const int num_pixels = cm->width * cm->height;

  if (is_key_frame) {
    set_vbp_thresholds_key_frame(cpi, thresholds, threshold_base,
                                 threshold_left_shift, num_pixels);
    return;
  }

  threshold_base = tune_base_thresh_content(
      cpi, threshold_base, content_lowsumdiff, source_sad_nonrd, num_pixels);
  thresholds[0] = threshold_base >> 1;
  thresholds[1] = threshold_base;
  thresholds[3] = threshold_base << threshold_left_shift;

  tune_thresh_based_on_resolution(cpi, thresholds, threshold_base,
                                  current_qindex, source_sad_rd, num_pixels);

  tune_thresh_based_on_qindex(cpi, thresholds, blk_sad, current_qindex,
                              num_pixels, is_segment_id_boosted,
                              source_sad_nonrd, lighting_change);
}